

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::TriangleCaseBase::TriangleCaseBase
          (TriangleCaseBase *this,Context *context,char *name,char *description,
          TriangleData *polysBegin,TriangleData *polysEnd,WindowRectangle *viewport)

{
  int iVar1;
  TriangleData *__last;
  TriangleData *__first;
  allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData> local_39
  ;
  TriangleData *local_38;
  TriangleData *polysEnd_local;
  TriangleData *polysBegin_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  TriangleCaseBase *this_local;
  
  local_38 = polysEnd;
  polysEnd_local = polysBegin;
  polysBegin_local = (TriangleData *)description;
  description_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  RenderTestCase::RenderTestCase(&this->super_RenderTestCase,context,name,description);
  __first = polysEnd_local;
  __last = local_38;
  (this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_032af058;
  std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>::
  allocator(&local_39);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>>
  ::
  vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData_const*,void>
            ((vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>>
              *)&this->m_polys,__first,__last,&local_39);
  std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>::
  ~allocator(&local_39);
  iVar1 = viewport->bottom;
  (this->m_viewport).left = viewport->left;
  (this->m_viewport).bottom = iVar1;
  iVar1 = viewport->height;
  (this->m_viewport).width = viewport->width;
  (this->m_viewport).height = iVar1;
  return;
}

Assistant:

TriangleCaseBase::TriangleCaseBase (Context& context, const char* name, const char* description, const TriangleData* polysBegin, const TriangleData* polysEnd, const rr::WindowRectangle& viewport)
	: RenderTestCase(context, name, description)
	, m_polys		(polysBegin, polysEnd)
	, m_viewport	(viewport)
{
}